

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O1

void __thiscall
cbtGImpactMeshShapePart::processAllTriangles
          (cbtGImpactMeshShapePart *this,cbtTriangleCallback *callback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  bool bVar5;
  cbtAlignedObjectArray<int> collided;
  cbtAABB box;
  cbtPrimitiveTriangle triangle;
  cbtAlignedObjectArray<int> cStack_b8;
  cbtAABB local_98;
  undefined1 local_78 [64];
  undefined4 local_38;
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  local_98.m_min.m_floats._0_8_ = *(undefined8 *)aabbMin->m_floats;
  local_98.m_min.m_floats._8_8_ = *(undefined8 *)(aabbMin->m_floats + 2);
  local_98.m_max.m_floats._0_8_ = *(undefined8 *)aabbMax->m_floats;
  local_98.m_max.m_floats._8_8_ = *(undefined8 *)(aabbMax->m_floats + 2);
  cStack_b8.m_ownsMemory = true;
  cStack_b8.m_data = (int *)0x0;
  cStack_b8.m_size = 0;
  cStack_b8.m_capacity = 0;
  cbtGImpactQuantizedBvh::boxQuery
            (&(this->super_cbtGImpactShapeInterface).m_box_set,&local_98,&cStack_b8);
  lVar4 = (long)cStack_b8.m_size;
  if (lVar4 == 0) {
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  else {
    uVar1 = (this->m_primitive_manager).m_part;
    local_38 = 0x3c23d70a;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      iVar2 = cStack_b8.m_data[lVar4];
      iVar3 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape
                ._vptr_cbtCollisionShape[0x15])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x28))
                ((long *)CONCAT44(extraout_var,iVar3),iVar2,local_78);
      (*callback->_vptr_cbtTriangleCallback[2])
                (callback,local_78,(ulong)uVar1,(ulong)(uint)cStack_b8.m_data[lVar4]);
    }
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&cStack_b8);
  return;
}

Assistant:

void cbtGImpactMeshShapePart::processAllTriangles(cbtTriangleCallback* callback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
	lockChildShapes();
	cbtAABB box;
	box.m_min = aabbMin;
	box.m_max = aabbMax;

	cbtAlignedObjectArray<int> collided;
	m_box_set.boxQuery(box, collided);

	if (collided.size() == 0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	cbtPrimitiveTriangle triangle;
	int i = collided.size();
	while (i--)
	{
		this->getPrimitiveTriangle(collided[i], triangle);
		callback->processTriangle(triangle.m_vertices, part, collided[i]);
	}
	unlockChildShapes();
}